

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFerTron_dns.c
# Opt level: O1

void SetInitialGuess1(N_Vector u,UserData data)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  
  pdVar3 = (double *)N_VGetArrayPointer();
  dVar1 = data->lb[0];
  dVar2 = data->lb[1];
  *pdVar3 = dVar1;
  pdVar3[1] = dVar2;
  pdVar3[2] = dVar1 - data->lb[0];
  pdVar3[3] = dVar1 - data->ub[0];
  pdVar3[4] = dVar2 - data->lb[1];
  pdVar3[5] = dVar2 - data->ub[1];
  return;
}

Assistant:

static void SetInitialGuess1(N_Vector u, UserData data)
{
  sunrealtype x1, x2;
  sunrealtype* udata;
  sunrealtype *lb, *ub;

  udata = N_VGetArrayPointer(u);

  lb = data->lb;
  ub = data->ub;

  /* There are two known solutions for this problem */

  /* this init. guess should take us to (0.29945; 2.83693) */
  x1 = lb[0];
  x2 = lb[1];

  udata[0] = x1;
  udata[1] = x2;
  udata[2] = x1 - lb[0];
  udata[3] = x1 - ub[0];
  udata[4] = x2 - lb[1];
  udata[5] = x2 - ub[1];
}